

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

JObject * __thiscall
pstack::JObject::field<char[6],char[8],char>(JObject *this,char (*k) [6],char (*v) [8],char *c)

{
  ostream *os;
  JSON<pstack::Field<char[6],_char[8]>,_char> local_48;
  undefined1 local_38 [8];
  Field<char[6],_char[8]> field;
  char *c_local;
  char (*v_local) [8];
  char (*k_local) [6];
  JObject *this_local;
  
  field.v = (char (*) [8])c;
  Field<char[6],_char[8]>::Field((Field<char[6],_char[8]> *)local_38,k,v);
  os = std::operator<<(this->os,this->sep);
  local_48 = json<pstack::Field<char[6],char[8]>,char>((Field<char[6],_char[8]> *)local_38,*field.v)
  ;
  pstack::operator<<(os,&local_48);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }